

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.h
# Opt level: O2

uint get_token_alloc(int mb_rows,int mb_cols,int sb_size_log2,int num_planes)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  
  bVar1 = (byte)sb_size_log2;
  bVar3 = bVar1 - 4;
  uVar2 = ~(-1 << (bVar3 & 0x1f));
  iVar4 = 2;
  if (num_planes < 2) {
    iVar4 = num_planes;
  }
  return ((int)(uVar2 + mb_cols) >> (bVar3 & 0x1f)) * ((int)(mb_rows + uVar2) >> (bVar3 & 0x1f)) *
         iVar4 * ((1 << (bVar1 & 0x1f)) << (bVar1 & 0x1f));
}

Assistant:

static inline unsigned int get_token_alloc(int mb_rows, int mb_cols,
                                           int sb_size_log2,
                                           const int num_planes) {
  // Calculate the maximum number of max superblocks in the image.
  const int shift = sb_size_log2 - 4;
  const int sb_size = 1 << sb_size_log2;
  const int sb_size_square = sb_size * sb_size;
  const int sb_rows = CEIL_POWER_OF_TWO(mb_rows, shift);
  const int sb_cols = CEIL_POWER_OF_TWO(mb_cols, shift);

  // One palette token for each pixel. There can be palettes on two planes.
  const int sb_palette_toks = AOMMIN(2, num_planes) * sb_size_square;

  return sb_rows * sb_cols * sb_palette_toks;
}